

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O3

void __thiscall sznet::Thread::Thread(Thread *this,ThreadFunc *func,string *n)

{
  pointer pcVar1;
  undefined8 uVar2;
  
  this->m_started = false;
  this->m_joined = false;
  this->m_pthreadId = 0;
  this->m_tid = 0;
  (this->m_func).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->m_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_func).super__Function_base._M_functor + 8) = 0;
  (this->m_func)._M_invoker = func->_M_invoker;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_func).super__Function_base._M_functor =
         *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_func).super__Function_base._M_functor + 8) = uVar2;
    (this->m_func).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + n->_M_string_length);
  CountDownLatch::CountDownLatch(&this->m_latch,1);
  setDefaultName(this);
  return;
}

Assistant:

Thread::Thread(ThreadFunc func, const string& n):
	m_started(false),
	m_joined(false),
	m_pthreadId(0),
	m_tid(0),
	m_func(std::move(func)),
	m_name(n),
	m_latch(1)
{
	setDefaultName();
}